

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
libcellml::Parser::ParserImpl::loadImport
          (ParserImpl *this,ImportSourcePtr *importSource,ModelPtr *model,XmlNodePtr *node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  IssueImpl *pIVar1;
  bool bVar2;
  bool bVar3;
  element_type *peVar4;
  element_type *peVar5;
  element_type *peVar6;
  ulong uVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  element_type *peVar11;
  element_type *peVar12;
  shared_ptr<libcellml::XmlNode> local_950;
  string local_940;
  string local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  string local_880;
  string local_860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  undefined1 local_7c0 [8];
  IssuePtr issue_8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  undefined1 local_710 [8];
  IssuePtr issue_7;
  string textNode;
  string local_6d8;
  undefined1 local_6b8 [8];
  IssuePtr issue_6;
  string local_698;
  string local_678;
  string local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  undefined1 local_578 [8];
  IssuePtr issue_5;
  string local_548;
  string local_528;
  undefined1 local_508 [8];
  XmlAttributePtr childAttribute_1;
  UnitsPtr importedUnits;
  string local_4e0;
  undefined1 local_4c0 [8];
  IssuePtr issue_4;
  string local_4a0;
  string local_480;
  string local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  undefined1 local_380 [8];
  IssuePtr issue_3;
  string local_350;
  string local_330;
  undefined1 local_310 [8];
  XmlAttributePtr childAttribute;
  ComponentPtr importedComponent;
  undefined1 local_2e8 [7];
  bool nameAttributePresent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  IssuePtr issue_2;
  XmlNodePtr childNode;
  string local_1c0;
  undefined1 local_1a0 [8];
  IssuePtr issue_1;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  IssuePtr issue;
  string local_90;
  byte local_59;
  undefined1 local_58 [7];
  bool hrefAttributePresent;
  string id;
  XmlAttributePtr attribute;
  XmlNodePtr *node_local;
  ModelPtr *model_local;
  ImportSourcePtr *importSource_local;
  ParserImpl *this_local;
  
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstAttribute((XmlNode *)((long)&id.field_2 + 8));
  std::__cxx11::string::string((string *)local_58);
  local_59 = 0;
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlAttribute> *)((long)&id.field_2 + 8),
                                 (nullptr_t)0x0), bVar2) {
    peVar10 = std::
              __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(id.field_2._M_local_buf + 8));
    bVar2 = XmlAttribute::isType(peVar10,"href","http://www.w3.org/1999/xlink");
    if (bVar2) {
      peVar4 = std::
               __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)importSource);
      peVar10 = std::
                __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)(id.field_2._M_local_buf + 8));
      XmlAttribute::value_abi_cxx11_(&local_90,peVar10);
      ImportSource::setUrl(peVar4,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_59 = 1;
    }
    else {
      bVar2 = isIdAttribute((XmlAttributePtr *)((long)&id.field_2 + 8),
                            (bool)(this->mParsing1XVersion & 1));
      if (bVar2) {
        peVar10 = std::
                  __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)(id.field_2._M_local_buf + 8));
        XmlAttribute::value_abi_cxx11_
                  ((string *)
                   &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,peVar10);
        this_00 = &issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        std::__cxx11::string::operator=((string *)local_58,(string *)this_00);
        std::__cxx11::string::~string((string *)this_00);
        peVar4 = std::
                 __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)importSource);
        Entity::setId(&peVar4->super_Entity,(string *)local_58);
      }
      else {
        peVar10 = std::
                  __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)(id.field_2._M_local_buf + 8));
        bVar2 = XmlAttribute::inNamespaceUri(peVar10,"http://www.w3.org/1999/xlink");
        if (!bVar2) {
          Issue::IssueImpl::create();
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_c0);
          pIVar1 = peVar5->mPimpl;
          peVar12 = std::
                    __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)node);
          XmlNode::attribute_abi_cxx11_(&local_160,peVar12,"href");
          std::operator+(&local_140,"Import from \'",&local_160);
          std::operator+(&local_120,&local_140,"\' has an invalid attribute \'");
          peVar10 = std::
                    __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)(id.field_2._M_local_buf + 8));
          XmlAttribute::name_abi_cxx11_(&local_180,peVar10);
          std::operator+(&local_100,&local_120,&local_180);
          std::operator+(&local_e0,&local_100,"\'.");
          Issue::IssueImpl::setDescription(pIVar1,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)&local_180);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_160);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_c0);
          peVar6 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar5->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_c0);
          Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORT_ELEMENT);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_c0);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_c0);
        }
      }
    }
    std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)(id.field_2._M_local_buf + 8));
    XmlAttribute::next((XmlAttribute *)
                       &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    std::shared_ptr<libcellml::XmlAttribute>::operator=
              ((shared_ptr<libcellml::XmlAttribute> *)((long)&id.field_2 + 8),
               (shared_ptr<libcellml::XmlAttribute> *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
              ((shared_ptr<libcellml::XmlAttribute> *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  if ((local_59 & 1) == 0) {
    Issue::IssueImpl::create();
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1a0);
    pIVar1 = peVar5->mPimpl;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,"Import does not specify an xlink:href attribute.",
               (allocator<char> *)
               ((long)&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    Issue::IssueImpl::setDescription(pIVar1,&local_1c0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&childNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1a0);
    peVar6 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1a0);
    Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORT_HREF);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_1a0);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_1a0);
  }
  std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             node);
  XmlNode::firstChild((XmlNode *)
                      &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  bVar2 = std::operator==((shared_ptr<libcellml::XmlNode> *)
                          &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount,(nullptr_t)0x0);
  if (bVar2) {
    Issue::IssueImpl::create();
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1e8);
      pIVar1 = peVar5->mPimpl;
      peVar12 = std::
                __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)node);
      XmlNode::attribute_abi_cxx11_((string *)local_2e8,peVar12,"href");
      std::operator+(&local_2c8,"Import from \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8)
      ;
      std::operator+(&local_2a8,&local_2c8,"\' has an identifier of \'");
      std::operator+(&local_288,&local_2a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      std::operator+(&local_268,&local_288,
                     "\' but is empty. The import will be disregarded and the associated identifier will be lost."
                    );
      Issue::IssueImpl::setDescription(pIVar1,&local_268);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_2c8);
      std::__cxx11::string::~string((string *)local_2e8);
    }
    else {
      peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1e8);
      pIVar1 = peVar5->mPimpl;
      peVar12 = std::
                __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)node);
      XmlNode::attribute_abi_cxx11_(&local_248,peVar12,"href");
      std::operator+(&local_228,"Import from \'",&local_248);
      std::operator+(&local_208,&local_228,"\' is empty and will be disregarded.");
      Issue::IssueImpl::setDescription(pIVar1,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::string::~string((string *)&local_248);
    }
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1e8);
    peVar6 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar5->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1e8);
    Issue::IssueImpl::setLevel(peVar5->mPimpl,WARNING);
    peVar5 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_1e8);
    Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORT_CHILD);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_1e8);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_1e8);
  }
  while (bVar2 = std::operator!=((shared_ptr<libcellml::XmlNode> *)
                                 &issue_2.
                                  super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount,(nullptr_t)0x0), bVar2) {
    bVar2 = parseNode(this,(XmlNodePtr *)
                           &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,"component");
    if (bVar2) {
      Component::create();
      std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      XmlNode::firstAttribute((XmlNode *)local_310);
      peVar8 = std::
               __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&childAttribute.
                              super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
      ImportedEntity::setImportSource(&peVar8->super_ImportedEntity,importSource);
      bVar2 = false;
      while (bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_310), bVar3) {
        peVar10 = std::
                  __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_310);
        bVar3 = XmlAttribute::isType(peVar10,"name","");
        if (bVar3) {
          peVar8 = std::
                   __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&childAttribute.
                                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount);
          peVar10 = std::
                    __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_310);
          XmlAttribute::value_abi_cxx11_(&local_330,peVar10);
          NamedEntity::setName((NamedEntity *)peVar8,&local_330);
          std::__cxx11::string::~string((string *)&local_330);
          bVar2 = true;
        }
        else {
          bVar3 = isIdAttribute((XmlAttributePtr *)local_310,(bool)(this->mParsing1XVersion & 1));
          if (bVar3) {
            peVar8 = std::
                     __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&childAttribute.
                                      super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            peVar10 = std::
                      __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_310);
            XmlAttribute::value_abi_cxx11_(&local_350,peVar10);
            Entity::setId((Entity *)peVar8,&local_350);
            std::__cxx11::string::~string((string *)&local_350);
          }
          else {
            peVar10 = std::
                      __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_310);
            bVar3 = XmlAttribute::isType(peVar10,"component_ref","");
            if (bVar3) {
              peVar8 = std::
                       __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&childAttribute.
                                        super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
              peVar10 = std::
                        __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_310);
              XmlAttribute::value_abi_cxx11_
                        ((string *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,peVar10);
              ImportedEntity::setImportReference
                        (&peVar8->super_ImportedEntity,
                         (string *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
              std::__cxx11::string::~string
                        ((string *)
                         &issue_3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
            }
            else {
              Issue::IssueImpl::create();
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_380);
              pIVar1 = peVar5->mPimpl;
              peVar12 = std::
                        __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&issue_2.
                                         super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
              XmlNode::attribute_abi_cxx11_(&local_460,peVar12,"name");
              std::operator+(&local_440,"Import of component \'",&local_460);
              std::operator+(&local_420,&local_440,"\' from \'");
              peVar12 = std::
                        __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)node);
              XmlNode::attribute_abi_cxx11_(&local_480,peVar12,"href");
              std::operator+(&local_400,&local_420,&local_480);
              std::operator+(&local_3e0,&local_400,"\' has an invalid attribute \'");
              peVar10 = std::
                        __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_310);
              XmlAttribute::name_abi_cxx11_(&local_4a0,peVar10);
              std::operator+(&local_3c0,&local_3e0,&local_4a0);
              std::operator+(&local_3a0,&local_3c0,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,&local_3a0);
              std::__cxx11::string::~string((string *)&local_3a0);
              std::__cxx11::string::~string((string *)&local_3c0);
              std::__cxx11::string::~string((string *)&local_4a0);
              std::__cxx11::string::~string((string *)&local_3e0);
              std::__cxx11::string::~string((string *)&local_400);
              std::__cxx11::string::~string((string *)&local_480);
              std::__cxx11::string::~string((string *)&local_420);
              std::__cxx11::string::~string((string *)&local_440);
              std::__cxx11::string::~string((string *)&local_460);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_380);
              peVar6 = std::
                       __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&peVar5->mPimpl->mItem);
              AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_380);
              Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORT_COMPONENT_ELEMENT);
              Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_380);
              std::shared_ptr<libcellml::Issue>::~shared_ptr
                        ((shared_ptr<libcellml::Issue> *)local_380);
            }
          }
        }
        std::__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_310);
        XmlAttribute::next((XmlAttribute *)
                           &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        std::shared_ptr<libcellml::XmlAttribute>::operator=
                  ((shared_ptr<libcellml::XmlAttribute> *)local_310,
                   (shared_ptr<libcellml::XmlAttribute> *)
                   &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                  ((shared_ptr<libcellml::XmlAttribute> *)
                   &issue_4.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      if (!bVar2) {
        Issue::IssueImpl::create();
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_4c0);
        pIVar1 = peVar5->mPimpl;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4e0,"Import of component does not specify a name attribute.",
                   (allocator<char> *)
                   ((long)&importedUnits.
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        Issue::IssueImpl::setDescription(pIVar1,&local_4e0);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&importedUnits.
                           super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_4c0);
        peVar6 = std::
                 __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&peVar5->mPimpl->mItem);
        AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
        peVar5 = std::
                 __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_4c0);
        Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORT_COMPONENT_NAME);
        Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_4c0);
        std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_4c0);
      }
      peVar11 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)model);
      ComponentEntity::addComponent
                (&peVar11->super_ComponentEntity,
                 (ComponentPtr *)
                 &childAttribute.
                  super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                ((shared_ptr<libcellml::XmlAttribute> *)local_310);
      std::shared_ptr<libcellml::Component>::~shared_ptr
                ((shared_ptr<libcellml::Component> *)
                 &childAttribute.
                  super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      bVar2 = parseNode(this,(XmlNodePtr *)
                             &issue_2.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,"units");
      if (bVar2) {
        Units::create();
        std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
        XmlNode::firstAttribute((XmlNode *)local_508);
        peVar9 = std::
                 __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&childAttribute_1.
                                super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
        ImportedEntity::setImportSource(&peVar9->super_ImportedEntity,importSource);
        bVar2 = false;
        while (bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_508), bVar3) {
          peVar10 = std::
                    __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_508);
          bVar3 = XmlAttribute::isType(peVar10,"name","");
          if (bVar3) {
            peVar9 = std::
                     __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&childAttribute_1.
                                      super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount);
            peVar10 = std::
                      __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_508);
            XmlAttribute::value_abi_cxx11_(&local_528,peVar10);
            NamedEntity::setName(&peVar9->super_NamedEntity,&local_528);
            std::__cxx11::string::~string((string *)&local_528);
            bVar2 = true;
          }
          else {
            bVar3 = isIdAttribute((XmlAttributePtr *)local_508,(bool)(this->mParsing1XVersion & 1));
            if (bVar3) {
              peVar9 = std::
                       __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)&childAttribute_1.
                                        super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount);
              peVar10 = std::
                        __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_508);
              XmlAttribute::value_abi_cxx11_(&local_548,peVar10);
              Entity::setId((Entity *)peVar9,&local_548);
              std::__cxx11::string::~string((string *)&local_548);
            }
            else {
              peVar10 = std::
                        __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_508);
              bVar3 = XmlAttribute::isType(peVar10,"units_ref","");
              if (bVar3) {
                peVar9 = std::
                         __shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&childAttribute_1.
                                          super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount);
                peVar10 = std::
                          __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_508);
                XmlAttribute::value_abi_cxx11_
                          ((string *)
                           &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,peVar10);
                ImportedEntity::setImportReference
                          (&peVar9->super_ImportedEntity,
                           (string *)
                           &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
                std::__cxx11::string::~string
                          ((string *)
                           &issue_5.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
              else {
                Issue::IssueImpl::create();
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_578);
                pIVar1 = peVar5->mPimpl;
                peVar12 = std::
                          __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&issue_2.
                                           super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_refcount);
                XmlNode::attribute_abi_cxx11_(&local_658,peVar12,"name");
                std::operator+(&local_638,"Import of units \'",&local_658);
                std::operator+(&local_618,&local_638,"\' from \'");
                peVar12 = std::
                          __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)node);
                XmlNode::attribute_abi_cxx11_(&local_678,peVar12,"href");
                std::operator+(&local_5f8,&local_618,&local_678);
                std::operator+(&local_5d8,&local_5f8,"\' has an invalid attribute \'");
                peVar10 = std::
                          __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)local_508);
                XmlAttribute::name_abi_cxx11_(&local_698,peVar10);
                std::operator+(&local_5b8,&local_5d8,&local_698);
                std::operator+(&local_598,&local_5b8,"\'.");
                Issue::IssueImpl::setDescription(pIVar1,&local_598);
                std::__cxx11::string::~string((string *)&local_598);
                std::__cxx11::string::~string((string *)&local_5b8);
                std::__cxx11::string::~string((string *)&local_698);
                std::__cxx11::string::~string((string *)&local_5d8);
                std::__cxx11::string::~string((string *)&local_5f8);
                std::__cxx11::string::~string((string *)&local_678);
                std::__cxx11::string::~string((string *)&local_618);
                std::__cxx11::string::~string((string *)&local_638);
                std::__cxx11::string::~string((string *)&local_658);
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_578);
                peVar6 = std::
                         __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)&peVar5->mPimpl->mItem);
                AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource)
                ;
                peVar5 = std::
                         __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_578);
                Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORT_UNITS_ELEMENT);
                Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_578);
                std::shared_ptr<libcellml::Issue>::~shared_ptr
                          ((shared_ptr<libcellml::Issue> *)local_578);
              }
            }
          }
          std::
          __shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_508);
          XmlAttribute::next((XmlAttribute *)
                             &issue_6.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          std::shared_ptr<libcellml::XmlAttribute>::operator=
                    ((shared_ptr<libcellml::XmlAttribute> *)local_508,
                     (shared_ptr<libcellml::XmlAttribute> *)
                     &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                    ((shared_ptr<libcellml::XmlAttribute> *)
                     &issue_6.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        if (!bVar2) {
          Issue::IssueImpl::create();
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_6b8);
          pIVar1 = peVar5->mPimpl;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6d8,"Import of units does not specify a name attribute.",
                     (allocator<char> *)(textNode.field_2._M_local_buf + 0xf));
          Issue::IssueImpl::setDescription(pIVar1,&local_6d8);
          std::__cxx11::string::~string((string *)&local_6d8);
          std::allocator<char>::~allocator((allocator<char> *)(textNode.field_2._M_local_buf + 0xf))
          ;
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_6b8);
          peVar6 = std::
                   __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&peVar5->mPimpl->mItem);
          AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
          peVar5 = std::
                   __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_6b8);
          Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,IMPORT_UNITS_NAME);
          Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_6b8);
          std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_6b8);
        }
        peVar11 = std::
                  __shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)model);
        Model::addUnits(peVar11,(UnitsPtr *)
                                &childAttribute_1.
                                 super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount);
        std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
                  ((shared_ptr<libcellml::XmlAttribute> *)local_508);
        std::shared_ptr<libcellml::Units>::~shared_ptr
                  ((shared_ptr<libcellml::Units> *)
                   &childAttribute_1.
                    super___shared_ptr<libcellml::XmlAttribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        peVar12 = std::
                  __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&issue_2.
                                   super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
        bVar2 = XmlNode::isText(peVar12);
        if (bVar2) {
          peVar12 = std::
                    __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&issue_2.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          XmlNode::convertToString_abi_cxx11_
                    ((string *)
                     &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,peVar12);
          bVar2 = hasNonWhitespaceCharacters
                            ((string *)
                             &issue_7.
                              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          if (bVar2) {
            Issue::IssueImpl::create();
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_710);
            pIVar1 = peVar5->mPimpl;
            peVar12 = std::
                      __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)node);
            XmlNode::attribute_abi_cxx11_
                      ((string *)
                       &issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,peVar12,"href");
            std::operator+(&local_790,"Import from \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
            std::operator+(&local_770,&local_790,
                           "\' has an invalid non-whitespace child text element \'");
            std::operator+(&local_750,&local_770,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
            std::operator+(&local_730,&local_750,"\'.");
            Issue::IssueImpl::setDescription(pIVar1,&local_730);
            std::__cxx11::string::~string((string *)&local_730);
            std::__cxx11::string::~string((string *)&local_750);
            std::__cxx11::string::~string((string *)&local_770);
            std::__cxx11::string::~string((string *)&local_790);
            std::__cxx11::string::~string
                      ((string *)
                       &issue_8.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_710);
            peVar6 = std::
                     __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar5->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_710);
            Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,XML_UNEXPECTED_CHARACTER);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_710);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_710);
          }
          std::__cxx11::string::~string
                    ((string *)
                     &issue_7.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          peVar12 = std::
                    __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&issue_2.
                                     super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
          bVar2 = XmlNode::isComment(peVar12);
          if (!bVar2) {
            Issue::IssueImpl::create();
            if ((this->mParsing1XVersion & 1U) == 0) {
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_7c0);
              pIVar1 = peVar5->mPimpl;
              peVar12 = std::
                        __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)node);
              XmlNode::attribute_abi_cxx11_(&local_920,peVar12,"href");
              std::operator+(&local_900,"Import from \'",&local_920);
              std::operator+(&local_8e0,&local_900,"\' has an invalid child element \'");
              peVar12 = std::
                        __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&issue_2.
                                         super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
              XmlNode::name_abi_cxx11_(&local_940,peVar12);
              std::operator+(&local_8c0,&local_8e0,&local_940);
              std::operator+(&local_8a0,&local_8c0,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,&local_8a0);
              std::__cxx11::string::~string((string *)&local_8a0);
              std::__cxx11::string::~string((string *)&local_8c0);
              std::__cxx11::string::~string((string *)&local_940);
              std::__cxx11::string::~string((string *)&local_8e0);
              std::__cxx11::string::~string((string *)&local_900);
              std::__cxx11::string::~string((string *)&local_920);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_7c0);
              Issue::IssueImpl::setReferenceRule(peVar5->mPimpl,XML_UNEXPECTED_ELEMENT);
            }
            else {
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_7c0);
              pIVar1 = peVar5->mPimpl;
              peVar12 = std::
                        __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)node);
              XmlNode::attribute_abi_cxx11_(&local_860,peVar12,"href");
              std::operator+(&local_840,"Import from \'",&local_860);
              std::operator+(&local_820,&local_840,"\' ignoring child element \'");
              peVar12 = std::
                        __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&issue_2.
                                         super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount);
              XmlNode::name_abi_cxx11_(&local_880,peVar12);
              std::operator+(&local_800,&local_820,&local_880);
              std::operator+(&local_7e0,&local_800,"\'.");
              Issue::IssueImpl::setDescription(pIVar1,&local_7e0);
              std::__cxx11::string::~string((string *)&local_7e0);
              std::__cxx11::string::~string((string *)&local_800);
              std::__cxx11::string::~string((string *)&local_880);
              std::__cxx11::string::~string((string *)&local_820);
              std::__cxx11::string::~string((string *)&local_840);
              std::__cxx11::string::~string((string *)&local_860);
              peVar5 = std::
                       __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_7c0);
              Issue::IssueImpl::setLevel(peVar5->mPimpl,MESSAGE);
            }
            peVar5 = std::
                     __shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_7c0);
            peVar6 = std::
                     __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&peVar5->mPimpl->mItem);
            AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar6->mPimpl,importSource);
            Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_7c0);
            std::shared_ptr<libcellml::Issue>::~shared_ptr
                      ((shared_ptr<libcellml::Issue> *)local_7c0);
          }
        }
      }
    }
    std::__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    XmlNode::next((XmlNode *)&local_950);
    std::shared_ptr<libcellml::XmlNode>::operator=
              ((shared_ptr<libcellml::XmlNode> *)
               &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&local_950);
    std::shared_ptr<libcellml::XmlNode>::~shared_ptr(&local_950);
  }
  std::shared_ptr<libcellml::XmlNode>::~shared_ptr
            ((shared_ptr<libcellml::XmlNode> *)
             &issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_58);
  std::shared_ptr<libcellml::XmlAttribute>::~shared_ptr
            ((shared_ptr<libcellml::XmlAttribute> *)((long)&id.field_2 + 8));
  return;
}

Assistant:

void Parser::ParserImpl::loadImport(ImportSourcePtr &importSource, const ModelPtr &model, const XmlNodePtr &node)
{
    XmlAttributePtr attribute = node->firstAttribute();
    std::string id;
    bool hrefAttributePresent = false;
    while (attribute != nullptr) {
        if (attribute->isType("href", XLINK_NS)) {
            importSource->setUrl(attribute->value());
            hrefAttributePresent = true;
        } else if (isIdAttribute(attribute, mParsing1XVersion)) {
            id = attribute->value();
            importSource->setId(id);
        } else if (attribute->inNamespaceUri(XLINK_NS)) {
            // Allow xlink attributes but do nothing for them.
        } else {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid attribute '" + attribute->name() + "'.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_ELEMENT);
            addIssue(issue);
        }
        attribute = attribute->next();
    }

    if (!hrefAttributePresent) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Import does not specify an xlink:href attribute.");
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF);
        addIssue(issue);
    }

    XmlNodePtr childNode = node->firstChild();

    if (childNode == nullptr) {
        auto issue = Issue::IssueImpl::create();
        if (id.empty()) {
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' is empty and will be disregarded.");
        } else {
            issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an identifier of '" + id + "' but is empty. The import will be disregarded and the associated identifier will be lost.");
        }
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setLevel(libcellml::Issue::Level::WARNING);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_CHILD);
        addIssue(issue);
    }
    bool nameAttributePresent;
    while (childNode != nullptr) {
        if (parseNode(childNode, "component")) {
            ComponentPtr importedComponent = Component::create();
            XmlAttributePtr childAttribute = childNode->firstAttribute();
            importedComponent->setImportSource(importSource);
            nameAttributePresent = false;
            while (childAttribute) {
                if (childAttribute->isType("name")) {
                    importedComponent->setName(childAttribute->value());
                    nameAttributePresent = true;
                } else if (isIdAttribute(childAttribute, mParsing1XVersion)) {
                    importedComponent->setId(childAttribute->value());
                } else if (childAttribute->isType("component_ref")) {
                    importedComponent->setImportReference(childAttribute->value());
                } else {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Import of component '" + childNode->attribute("name") + "' from '" + node->attribute("href") + "' has an invalid attribute '" + childAttribute->name() + "'.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_COMPONENT_ELEMENT);
                    addIssue(issue);
                }
                childAttribute = childAttribute->next();
            }

            if (!nameAttributePresent) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import of component does not specify a name attribute.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_COMPONENT_NAME);
                addIssue(issue);
            }

            model->addComponent(importedComponent);
        } else if (parseNode(childNode, "units")) {
            UnitsPtr importedUnits = Units::create();
            XmlAttributePtr childAttribute = childNode->firstAttribute();
            importedUnits->setImportSource(importSource);
            nameAttributePresent = false;
            while (childAttribute) {
                if (childAttribute->isType("name")) {
                    importedUnits->setName(childAttribute->value());
                    nameAttributePresent = true;
                } else if (isIdAttribute(childAttribute, mParsing1XVersion)) {
                    importedUnits->setId(childAttribute->value());
                } else if (childAttribute->isType("units_ref")) {
                    importedUnits->setImportReference(childAttribute->value());
                } else {
                    auto issue = Issue::IssueImpl::create();
                    issue->mPimpl->setDescription("Import of units '" + childNode->attribute("name") + "' from '" + node->attribute("href") + "' has an invalid attribute '" + childAttribute->name() + "'.");
                    issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                    issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_ELEMENT);
                    addIssue(issue);
                }
                childAttribute = childAttribute->next();
            }

            if (!nameAttributePresent) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import of units does not specify a name attribute.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_UNITS_NAME);
                addIssue(issue);
            }

            model->addUnits(importedUnits);
        } else if (childNode->isText()) {
            const std::string textNode = childNode->convertToString();
            // Ignore whitespace when parsing.
            if (hasNonWhitespaceCharacters(textNode)) {
                auto issue = Issue::IssueImpl::create();
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid non-whitespace child text element '" + textNode + "'.");
                issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_CHARACTER);
                addIssue(issue);
            }
        } else if (childNode->isComment()) {
            // Do nothing.
        } else {
            auto issue = Issue::IssueImpl::create();
            if (mParsing1XVersion) {
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' ignoring child element '" + childNode->name() + "'.");
                issue->mPimpl->setLevel(Issue::Level::MESSAGE);
            } else {
                issue->mPimpl->setDescription("Import from '" + node->attribute("href") + "' has an invalid child element '" + childNode->name() + "'.");
                issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_UNEXPECTED_ELEMENT);
            }
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            addIssue(issue);
        }
        childNode = childNode->next();
    }
}